

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O3

size_t lddmc_test_ismdd(MDD mdd)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint8_t *puVar4;
  int iVar5;
  size_t sVar6;
  long lVar7;
  bool bVar8;
  uint uVar9;
  size_t local_38;
  
  if (mdd < 2) {
    return mdd;
  }
  uVar2 = *(ulong *)(nodes->data + mdd * 0x10 + 8);
  if (((uint)uVar2 >> 0x10 & 1) == 0) {
    local_38 = 0;
  }
  else {
    uVar3 = *(ulong *)(nodes->data + mdd * 0x10);
    local_38 = lddmc_test_ismdd(uVar2 >> 0x11);
    if (local_38 == 0) {
      __assert_fail("depth >= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                    ,0xa7d,"size_t lddmc_test_ismdd(MDD)");
    }
    mdd = uVar3 >> 1 & 0x7fffffffffff;
    if (mdd == 0) goto LAB_001100f4;
  }
  bVar8 = false;
  uVar9 = 0;
  do {
    iVar5 = llmsset_is_marked(nodes,mdd);
    if (iVar5 == 0) {
      __assert_fail("llmsset_is_marked(nodes, mdd)",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                    ,0xa83,"size_t lddmc_test_ismdd(MDD)");
    }
    lVar7 = mdd * 0x10;
    puVar4 = nodes->data;
    uVar2 = *(ulong *)(puVar4 + lVar7 + 8);
    if (((uint)uVar2 >> 0x10 & 1) != 0) {
      __assert_fail("mddnode_getcopy(n) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                    ,0xa87,"size_t lddmc_test_ismdd(MDD)");
    }
    uVar1 = *(uint *)(puVar4 + lVar7 + 6);
    if (bVar8) {
      if (uVar1 <= uVar9) {
        __assert_fail("value < next_value",
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                      ,0xa8d,"size_t lddmc_test_ismdd(MDD)");
      }
      sVar6 = lddmc_test_ismdd(uVar2 >> 0x11);
      if (local_38 != sVar6) {
        __assert_fail("depth == lddmc_test_ismdd(mddnode_getdown(n))",
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                      ,0xa8e,"size_t lddmc_test_ismdd(MDD)");
      }
    }
    else {
      local_38 = lddmc_test_ismdd(uVar2 >> 0x11);
      if (local_38 == 0) {
        __assert_fail("depth >= 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                      ,0xa8b,"size_t lddmc_test_ismdd(MDD)");
      }
    }
    bVar8 = true;
    mdd = *(ulong *)(puVar4 + lVar7) >> 1 & 0x7fffffffffff;
    uVar9 = uVar1;
  } while (mdd != 0);
LAB_001100f4:
  return local_38 + 1;
}

Assistant:

size_t
lddmc_test_ismdd(MDD mdd)
{
    if (mdd == lddmc_true) return 1;
    if (mdd == lddmc_false) return 0;

    int first = 1;
    size_t depth = 0;

    if (mdd != lddmc_false) {
        mddnode_t n = LDD_GETNODE(mdd);
        if (mddnode_getcopy(n)) {
            mdd = mddnode_getright(n);
            depth = lddmc_test_ismdd(mddnode_getdown(n));
            assert(depth >= 1);
        }
    }

    uint32_t value = 0;
    while (mdd != lddmc_false) {
        assert(llmsset_is_marked(nodes, mdd));

        mddnode_t n = LDD_GETNODE(mdd);
        uint32_t next_value = mddnode_getvalue(n);
        assert(mddnode_getcopy(n) == 0);
        if (first) {
            first = 0;
            depth = lddmc_test_ismdd(mddnode_getdown(n));
            assert(depth >= 1);
        } else {
            assert(value < next_value);
            assert(depth == lddmc_test_ismdd(mddnode_getdown(n)));
        }

        value = next_value;
        mdd = mddnode_getright(n);
    }

    return 1 + depth;
}